

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_U_upper.c
# Opt level: O1

void test_option_U_upper(void)

{
  wchar_t wVar1;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'\r',"file1",L'Ƥ',L'\xffffffff',"file1");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'\x0e',"d1",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'\x0f',"d1/file1",L'Ƥ',L'\xffffffff',"d1/file1");
  wVar1 = systemf("%s -cf archive.tar file1 d1/file1",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'\x10',0,"0",(long)wVar1,
                      "systemf(\"%s -cf archive.tar file1 d1/file1\", testprog)",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'\x1a',"test1",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                  ,L'\x1b',"test1");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'\x1c',"file1",L'Ƥ',L'\xffffffff',"file1new");
  assertion_make_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'\x1d',"file2","file1");
  wVar1 = systemf("%s -xf ../archive.tar >test.out 2>test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'\x1f',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../archive.tar >test.out 2>test.err\", testprog)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L' ',"file1",L'\x05',"file1");
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'!',"file1new",L'\b',"file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'\"',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'#',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                  ,L'$',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'(',"test2",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                  ,L')',"test2");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'*',"file1",L'Ƥ',L'\xffffffff',"file1new");
  assertion_make_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'+',"file2","file1");
  wVar1 = systemf("%s -xUf ../archive.tar >test.out 2>test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                      ,L'-',0,"0",(long)wVar1,
                      "systemf(\"%s -xUf ../archive.tar >test.out 2>test.err\", testprog)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'.',"file1",L'\x05',"file1");
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'/',"file1new",L'\b',"file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'0',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
             ,L'1',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                  ,L'2',"..");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'<',"test3",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'=',"test3");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'>',"realDir",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'?',"d1","realDir",L'\x01');
    wVar1 = systemf("%s -xf ../archive.tar d1/file1 >test.out 2>test.err",testprog);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'A',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'B',"d1","realDir",L'\x01');
    assertion_file_not_exists
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'C',"d1/file1");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'D',"test.out");
    assertion_non_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'E',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'F',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'I',"test4",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'J',"test4");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'K',"realDir",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'L',"d1","realDir",L'\x01');
    wVar1 = systemf("%s -xUf ../archive.tar >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L'N',0,"0",(long)wVar1,
                        "systemf(\"%s -xUf ../archive.tar >test.out 2>test.err\", testprog)",
                        (void *)0x0);
    assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'O',"d1",L'\xffffffff');
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'P',"d1/file1",L'\b',"d1/file1");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'Q',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'R',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'S',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'V',"test5",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'W',"test5");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'X',"realDir",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'Y',"d1","realDir",L'\x01');
    wVar1 = systemf("%s -xPf ../archive.tar d1/file1 >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L'[',0,"0",(long)wVar1,
                        "systemf(\"%s -xPf ../archive.tar d1/file1 >test.out 2>test.err\", testprog)"
                        ,(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'\\',"d1","realDir",L'\x01');
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L']',"d1/file1",L'\b',"d1/file1");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'^',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'_',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'`',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'c',"test6",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'd',"test6");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'e',"realDir",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'f',"d1","realDir",L'\x01');
    wVar1 = systemf("%s -xPUf ../archive.tar d1/file1 >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L'h',0,"0",(long)wVar1,
                        "systemf(\"%s -xPUf ../archive.tar d1/file1 >test.out 2>test.err\", testprog)"
                        ,(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'i',"d1","realDir",L'\x01');
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'j',"d1/file1",L'\b',"d1/file1");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'k',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'l',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'm',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'p',"test7",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'q',"test7");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'r',"d1",L'ǭ');
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L's',"d1/realfile1",L'Ƥ',L'\xffffffff',"realfile1");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L't',"d1/file1","d1/realfile1",L'\0');
    wVar1 = systemf("%s -xf ../archive.tar d1/file1 >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L'v',0,"0",(long)wVar1,
                        "systemf(\"%s -xf ../archive.tar d1/file1 >test.out 2>test.err\", testprog)"
                        ,(void *)0x0);
    wVar1 = umasked(0x1a4);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'w',"d1/file1",wVar1);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'x',"d1/file1",L'\b',"d1/file1");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'y',"realfile1",L'\t',"d1/realfile1");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'z',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'{',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'|',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'\x7f',"test8",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'\x80',"test8");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                       ,L'\x81',"d1",L'ǭ');
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L'\x82',"d1/realfile1",L'Ƥ',L'\xffffffff',"realfile1");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'\x83',"d1/file1","d1/realfile1",L'\0');
    wVar1 = systemf("%s -xPUf ../archive.tar d1/file1 >test.out 2>test.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                        ,L'\x85',0,"0",(long)wVar1,
                        "systemf(\"%s -xPUf ../archive.tar d1/file1 >test.out 2>test.err\", testprog)"
                        ,(void *)0x0);
    wVar1 = umasked(0x1a4);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                     ,L'\x86',"d1/file1",wVar1);
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'\x87',"d1/file1",L'\b',"d1/file1");
    assertion_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'\x88',"realfile1",L'\t',"d1/realfile1");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'\x89',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
               ,L'\x8a',"test.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_U_upper.c"
                    ,L'\x8b',"..");
    return;
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_U_upper)
{
	int r;

	assertMakeFile("file1", 0644, "file1");
	assertMakeDir("d1", 0755);
	assertMakeFile("d1/file1", 0644, "d1/file1");
	assertEqualInt(0, systemf("%s -cf archive.tar file1 d1/file1", testprog));

	/*
	 * bsdtar's man page used to claim that -x without -U would
	 * not break hard links.  This was and is nonsense.  The first
	 * two tests here simply verify that existing hard links get
	 * broken regardless.
	 */

	/* Test 1: -x without -U */
	assertMakeDir("test1", 0755);
	assertChdir("test1");
	assertMakeFile("file1", 0644, "file1new");
	assertMakeHardlink("file2", "file1");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar >test.out 2>test.err", testprog));
	assertFileContents("file1", 5, "file1");
	assertFileContents("file1new", 8, "file2");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");


	/* Test 2: -x with -U */
	assertMakeDir("test2", 0755);
	assertChdir("test2");
	assertMakeFile("file1", 0644, "file1new");
	assertMakeHardlink("file2", "file1");
	assertEqualInt(0,
	    systemf("%s -xUf ../archive.tar >test.out 2>test.err", testprog));
	assertFileContents("file1", 5, "file1");
	assertFileContents("file1new", 8, "file2");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/*
	 * -U does make a difference in how bsdtar handles unwanted symlinks,
	 * though.  It interacts with -P.
	 */
	if (!canSymlink())
		return;

	/* Test 3: Intermediate dir symlink causes error by default */
	assertMakeDir("test3", 0755);
	assertChdir("test3");
	assertMakeDir("realDir", 0755);
	assertMakeSymlink("d1", "realDir", 1);
	r = systemf("%s -xf ../archive.tar d1/file1 >test.out 2>test.err", testprog);
	assert(r != 0);
	assertIsSymlink("d1", "realDir", 1);
	assertFileNotExists("d1/file1");
	assertEmptyFile("test.out");
	assertNonEmptyFile("test.err");
	assertChdir("..");

	/* Test 4: Intermediate dir symlink gets removed with -U */
	assertMakeDir("test4", 0755);
	assertChdir("test4");
	assertMakeDir("realDir", 0755);
	assertMakeSymlink("d1", "realDir", 1);
	assertEqualInt(0,
	    systemf("%s -xUf ../archive.tar >test.out 2>test.err", testprog));
	assertIsDir("d1", -1);
	assertFileContents("d1/file1", 8, "d1/file1");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 5: Intermediate dir symlink is followed with -P */
	assertMakeDir("test5", 0755);
	assertChdir("test5");
	assertMakeDir("realDir", 0755);
	assertMakeSymlink("d1", "realDir", 1);
	assertEqualInt(0,
	    systemf("%s -xPf ../archive.tar d1/file1 >test.out 2>test.err", testprog));
	assertIsSymlink("d1", "realDir", 1);
	assertFileContents("d1/file1", 8, "d1/file1");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 6: Intermediate dir symlink is followed with -PU */
	assertMakeDir("test6", 0755);
	assertChdir("test6");
	assertMakeDir("realDir", 0755);
	assertMakeSymlink("d1", "realDir", 1);
	assertEqualInt(0,
	    systemf("%s -xPUf ../archive.tar d1/file1 >test.out 2>test.err", testprog));
	assertIsSymlink("d1", "realDir", 1);
	assertFileContents("d1/file1", 8, "d1/file1");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 7: Final file symlink replaced by default */
	assertMakeDir("test7", 0755);
	assertChdir("test7");
	assertMakeDir("d1", 0755);
	assertMakeFile("d1/realfile1", 0644, "realfile1");
	assertMakeSymlink("d1/file1", "d1/realfile1", 0);
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar d1/file1 >test.out 2>test.err", testprog));
	assertIsReg("d1/file1", umasked(0644));
	assertFileContents("d1/file1", 8, "d1/file1");
	assertFileContents("realfile1", 9, "d1/realfile1");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 8: Final file symlink replaced with -PU */
	assertMakeDir("test8", 0755);
	assertChdir("test8");
	assertMakeDir("d1", 0755);
	assertMakeFile("d1/realfile1", 0644, "realfile1");
	assertMakeSymlink("d1/file1", "d1/realfile1", 0);
	assertEqualInt(0,
	    systemf("%s -xPUf ../archive.tar d1/file1 >test.out 2>test.err", testprog));
	assertIsReg("d1/file1", umasked(0644));
	assertFileContents("d1/file1", 8, "d1/file1");
	assertFileContents("realfile1", 9, "d1/realfile1");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");
}